

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_sge_8_pd7(void)

{
  uint uVar1;
  uint uVar2;
  uint addr_in;
  uint value;
  
  uVar2 = m68ki_cpu.v_flag;
  uVar1 = m68ki_cpu.n_flag;
  addr_in = m68ki_cpu.dar[0xf] - 2;
  m68ki_cpu.dar[0xf] = addr_in;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  value = 0xff;
  if ((char)((byte)uVar2 ^ (byte)uVar1) < '\0') {
    value = 0;
  }
  m68k_write_memory_8(addr_in & m68ki_cpu.address_mask,value);
  return;
}

Assistant:

static void m68k_op_sge_8_pd7(void)
{
	m68ki_write_8(EA_A7_PD_8(), COND_GE() ? 0xff : 0);
}